

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O1

bool __thiscall IR::Instr::HasFixedFunctionAddressTarget(Instr *this)

{
  OpCode OVar1;
  Opnd *pOVar2;
  code *pcVar3;
  bool bVar4;
  OpndKind OVar5;
  undefined4 *puVar6;
  
  OVar1 = this->m_opcode;
  if (OVar1 < NewScObjectSpread) {
    if (((5 < OVar1 - 0xc4) || ((0x29U >> (OVar1 - 0xc4 & 0x1f) & 1) == 0)) && (OVar1 != CallI)) {
LAB_004c177f:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                         ,0xd60,
                         "(this->m_opcode == Js::OpCode::CallI || this->m_opcode == Js::OpCode::CallIFixed || this->m_opcode == Js::OpCode::NewScObject || this->m_opcode == Js::OpCode::NewScObjectSpread || this->m_opcode == Js::OpCode::NewScObjArray || this->m_opcode == Js::OpCode::NewScObjArraySpread || this->m_opcode == Js::OpCode::NewScObjectNoCtor)"
                         ,
                         "this->m_opcode == Js::OpCode::CallI || this->m_opcode == Js::OpCode::CallIFixed || this->m_opcode == Js::OpCode::NewScObject || this->m_opcode == Js::OpCode::NewScObjectSpread || this->m_opcode == Js::OpCode::NewScObjArray || this->m_opcode == Js::OpCode::NewScObjArraySpread || this->m_opcode == Js::OpCode::NewScObjectNoCtor"
                        );
      if (!bVar4) goto LAB_004c18d1;
      *puVar6 = 0;
    }
  }
  else if (((OVar1 != NewScObjectSpread) && (OVar1 != NewScObjectNoCtor)) && (OVar1 != CallIFixed))
  goto LAB_004c177f;
  if ((this->m_src1 != (Opnd *)0x0) && (OVar5 = Opnd::GetKind(this->m_src1), OVar5 == OpndKindAddr))
  {
    pOVar2 = this->m_src1;
    OVar5 = Opnd::GetKind(pOVar2);
    if (OVar5 != OpndKindAddr) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
      if (!bVar4) goto LAB_004c18d1;
      *puVar6 = 0;
    }
    if (*(byte *)((long)&pOVar2[2].m_valueType.field_0.bits + 1) == 10) {
      pOVar2 = this->m_src1;
      OVar5 = Opnd::GetKind(pOVar2);
      if (OVar5 != OpndKindAddr) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
        if (!bVar4) {
LAB_004c18d1:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar6 = 0;
      }
      return (bool)((*(byte *)&pOVar2[2].m_valueType.field_0 & 2) >> 1);
    }
  }
  return false;
}

Assistant:

bool Instr::HasFixedFunctionAddressTarget() const
{
    Assert(
        this->m_opcode == Js::OpCode::CallI ||
        this->m_opcode == Js::OpCode::CallIFixed ||
        this->m_opcode == Js::OpCode::NewScObject ||
        this->m_opcode == Js::OpCode::NewScObjectSpread ||
        this->m_opcode == Js::OpCode::NewScObjArray ||
        this->m_opcode == Js::OpCode::NewScObjArraySpread ||
        this->m_opcode == Js::OpCode::NewScObjectNoCtor);
    return
        this->GetSrc1() != nullptr &&
        this->GetSrc1()->IsAddrOpnd() &&
        this->GetSrc1()->AsAddrOpnd()->GetAddrOpndKind() == IR::AddrOpndKind::AddrOpndKindDynamicVar &&
        this->GetSrc1()->AsAddrOpnd()->m_isFunction;
}